

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh4_factory.cpp
# Opt level: O2

Accel * __thiscall embree::BVH4Factory::BVH4SubdivPatch1MB(BVH4Factory *this,Scene *scene)

{
  BVHN<4> *this_00;
  Builder *builder;
  AccelInstance *this_01;
  Intersectors intersectors;
  Intersectors IStack_138;
  
  this_00 = (BVHN<4> *)BVHN<4>::operator_new(0x240);
  BVHN<4>::BVHN(this_00,(PrimitiveType *)&SubdivPatch1::type,scene);
  BVH4SubdivPatch1MBIntersectors(&IStack_138,this,this_00);
  builder = (*this->BVH4SubdivPatch1MBBuilderSAH)(this_00,scene,0);
  this_01 = (AccelInstance *)Accel::operator_new(0x180);
  AccelInstance::AccelInstance(this_01,(AccelData *)this_00,builder,&IStack_138);
  return &this_01->super_Accel;
}

Assistant:

Accel* BVH4Factory::BVH4SubdivPatch1MB(Scene* scene)
  {
    BVH4* accel = new BVH4(SubdivPatch1::type,scene);
    Accel::Intersectors intersectors = BVH4SubdivPatch1MBIntersectors(accel);
    Builder* builder = BVH4SubdivPatch1MBBuilderSAH(accel,scene,0);
    return new AccelInstance(accel,builder,intersectors);
  }